

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

bool gpt_params_parse(int argc,char **argv,gpt_params *params)

{
  istreambuf_iterator<char,_std::char_traits<char>_> __last;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  int *in_RDX;
  long in_RSI;
  int in_EDI;
  float fVar6;
  ifstream file;
  string arg;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaa8;
  gpt_params *in_stack_fffffffffffffab0;
  FILE *__stream;
  undefined2 in_stack_fffffffffffffab8;
  undefined1 in_stack_fffffffffffffaba;
  undefined1 in_stack_fffffffffffffabb;
  undefined1 in_stack_fffffffffffffabc;
  undefined1 in_stack_fffffffffffffabd;
  undefined1 in_stack_fffffffffffffabe;
  undefined1 in_stack_fffffffffffffabf;
  undefined1 in_stack_fffffffffffffac0;
  undefined1 in_stack_fffffffffffffac1;
  undefined1 in_stack_fffffffffffffac2;
  undefined1 in_stack_fffffffffffffac3;
  int in_stack_fffffffffffffac4;
  allocator<char> *in_stack_fffffffffffffae0;
  allocator<char> *in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaf0;
  int in_stack_fffffffffffffaf4;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb20;
  float in_stack_fffffffffffffb24;
  undefined8 in_stack_fffffffffffffb28;
  allocator<char> *in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb38;
  int in_stack_fffffffffffffb3c;
  allocator<char> local_419 [40];
  allocator<char> local_3f1 [40];
  allocator<char> local_3c9 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a1;
  allocator<char> local_379 [40];
  allocator<char> local_351 [40];
  allocator<char> local_329 [40];
  allocator<char> local_301 [33];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d8;
  undefined1 local_2b0 [527];
  allocator<char> local_a1 [40];
  allocator<char> local_79 [56];
  allocator<char> local_41 [37];
  int local_1c;
  int *local_18;
  long local_10;
  int local_4;
  
  local_1c = 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_4 = in_EDI;
  do {
    if (local_4 <= local_1c) {
      return true;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
               (char *)in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
    std::allocator<char>::~allocator(local_41);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffab0,(char *)in_stack_fffffffffffffaa8);
    if ((bVar1) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffab0,(char *)in_stack_fffffffffffffaa8), bVar1
       )) {
      local_1c = local_1c + 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                 (char *)in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
      iVar3 = std::__cxx11::stoi((string *)in_stack_fffffffffffffab0,
                                 (size_t *)in_stack_fffffffffffffaa8,0);
      *local_18 = iVar3;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffab0);
      std::allocator<char>::~allocator(local_79);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffab0,(char *)in_stack_fffffffffffffaa8);
      if ((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffab0,(char *)in_stack_fffffffffffffaa8),
         bVar1)) {
        local_1c = local_1c + 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                   (char *)in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
        iVar3 = std::__cxx11::stoi((string *)in_stack_fffffffffffffab0,
                                   (size_t *)in_stack_fffffffffffffaa8,0);
        local_18[1] = iVar3;
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffab0);
        std::allocator<char>::~allocator(local_a1);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffab0,(char *)in_stack_fffffffffffffaa8);
        if ((bVar1) ||
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffab0,(char *)in_stack_fffffffffffffaa8),
           bVar1)) {
          *(undefined1 *)((long)local_18 + 0x69) = 0;
          *(undefined1 *)((long)local_18 + 0x6a) = 0;
          *(undefined1 *)(local_18 + 0x1a) = 0;
          local_1c = local_1c + 1;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffab0,(char *)in_stack_fffffffffffffaa8);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffab0,(char *)in_stack_fffffffffffffaa8);
          if ((bVar1) ||
             (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffffab0,(char *)in_stack_fffffffffffffaa8
                                     ), bVar1)) {
            *(undefined1 *)((long)local_18 + 0x69) = 0;
            *(undefined1 *)((long)local_18 + 0x6a) = 0;
            *(undefined1 *)(local_18 + 0x1a) = 0;
            lVar5 = (long)local_1c;
            local_1c = local_1c + 1;
            std::ifstream::ifstream(local_2b0,*(char **)(local_10 + 8 + lVar5 * 8),_S_in);
            std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
                      ((istreambuf_iterator<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffffac4,
                                CONCAT13(in_stack_fffffffffffffac3,
                                         CONCAT12(in_stack_fffffffffffffac2,
                                                  CONCAT11(in_stack_fffffffffffffac1,
                                                           in_stack_fffffffffffffac0)))),
                       (istream_type *)
                       CONCAT17(in_stack_fffffffffffffabf,
                                CONCAT16(in_stack_fffffffffffffabe,
                                         CONCAT15(in_stack_fffffffffffffabd,
                                                  CONCAT14(in_stack_fffffffffffffabc,
                                                           CONCAT13(in_stack_fffffffffffffabb,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffaba,
                                                  in_stack_fffffffffffffab8)))))));
            std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
                      ((istreambuf_iterator<char,_std::char_traits<char>_> *)
                       in_stack_fffffffffffffab0);
            local_2d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        std::back_inserter<std::__cxx11::string>(in_stack_fffffffffffffaa8);
            __first._M_c = in_stack_fffffffffffffb38;
            __first._M_sbuf = (streambuf_type *)in_stack_fffffffffffffb30;
            __first._12_4_ = in_stack_fffffffffffffb3c;
            __last._M_sbuf._4_4_ = in_stack_fffffffffffffb24;
            __last._M_sbuf._0_4_ = in_stack_fffffffffffffb20;
            __last._8_8_ = in_stack_fffffffffffffb28;
            local_2e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        std::
                        copy<std::istreambuf_iterator<char,std::char_traits<char>>,std::back_insert_iterator<std::__cxx11::string>>
                                  (__first,__last,in_stack_fffffffffffffb18);
            std::ifstream::~ifstream(local_2b0);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffab0,(char *)in_stack_fffffffffffffaa8);
            if ((bVar1) ||
               (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_fffffffffffffab0,
                                        (char *)in_stack_fffffffffffffaa8), bVar1)) {
              local_1c = local_1c + 1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                         (char *)in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
              iVar3 = std::__cxx11::stoi((string *)in_stack_fffffffffffffab0,
                                         (size_t *)in_stack_fffffffffffffaa8,0);
              local_18[2] = iVar3;
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffab0);
              std::allocator<char>::~allocator(local_301);
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffffab0,(char *)in_stack_fffffffffffffaa8
                                     );
              if (bVar1) {
                local_1c = local_1c + 1;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                           (char *)in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
                iVar3 = std::__cxx11::stoi((string *)in_stack_fffffffffffffab0,
                                           (size_t *)in_stack_fffffffffffffaa8,0);
                local_18[5] = iVar3;
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffab0);
                std::allocator<char>::~allocator(local_329);
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_fffffffffffffab0,
                                        (char *)in_stack_fffffffffffffaa8);
                if ((bVar1) ||
                   (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)in_stack_fffffffffffffab0,
                                            (char *)in_stack_fffffffffffffaa8), bVar1)) {
                  local_1c = local_1c + 1;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                             (char *)in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
                  in_stack_fffffffffffffb3c =
                       std::__cxx11::stoi((string *)in_stack_fffffffffffffab0,
                                          (size_t *)in_stack_fffffffffffffaa8,0);
                  local_18[4] = in_stack_fffffffffffffb3c;
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffab0);
                  std::allocator<char>::~allocator(local_351);
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)in_stack_fffffffffffffab0,
                                          (char *)in_stack_fffffffffffffaa8);
                  in_stack_fffffffffffffb38 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffb38);
                  if (bVar1) {
                    lVar5 = (long)local_1c;
                    local_1c = local_1c + 1;
                    in_stack_fffffffffffffb28 = *(undefined8 *)(local_10 + 8 + lVar5 * 8);
                    in_stack_fffffffffffffb30 = local_379;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                               (char *)in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
                    in_stack_fffffffffffffb24 =
                         std::__cxx11::stof((string *)in_stack_fffffffffffffab0,
                                            (size_t *)in_stack_fffffffffffffaa8);
                    local_18[6] = (int)in_stack_fffffffffffffb24;
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffab0);
                    std::allocator<char>::~allocator(local_379);
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)in_stack_fffffffffffffab0,
                                            (char *)in_stack_fffffffffffffaa8);
                    in_stack_fffffffffffffb20 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffb20);
                    if (bVar1) {
                      local_1c = local_1c + 1;
                      in_stack_fffffffffffffb18.container = &local_3a1;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                                 (char *)in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
                      fVar6 = std::__cxx11::stof((string *)in_stack_fffffffffffffab0,
                                                 (size_t *)in_stack_fffffffffffffaa8);
                      local_18[7] = (int)fVar6;
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffffab0);
                      std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)in_stack_fffffffffffffab0,
                                              (char *)in_stack_fffffffffffffaa8);
                      if (bVar1) {
                        local_1c = local_1c + 1;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                                   (char *)in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
                        in_stack_fffffffffffffaf4 =
                             std::__cxx11::stoi((string *)in_stack_fffffffffffffab0,
                                                (size_t *)in_stack_fffffffffffffaa8,0);
                        local_18[3] = in_stack_fffffffffffffaf4;
                        std::__cxx11::string::~string
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffffab0);
                        std::allocator<char>::~allocator(local_3c9);
                      }
                      else {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)in_stack_fffffffffffffab0,
                                                (char *)in_stack_fffffffffffffaa8);
                        in_stack_fffffffffffffaf0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffaf0);
                        if (bVar1) {
                          lVar5 = (long)local_1c;
                          local_1c = local_1c + 1;
                          in_stack_fffffffffffffae0 =
                               *(allocator<char> **)(local_10 + 8 + lVar5 * 8);
                          in_stack_fffffffffffffae8 = local_3f1;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0
                                                ),(char *)in_stack_fffffffffffffae8,
                                     in_stack_fffffffffffffae0);
                          fVar6 = std::__cxx11::stof((string *)in_stack_fffffffffffffab0,
                                                     (size_t *)in_stack_fffffffffffffaa8);
                          local_18[8] = (int)fVar6;
                          std::__cxx11::string::~string
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_fffffffffffffab0);
                          std::allocator<char>::~allocator(local_3f1);
                        }
                        else {
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffab0,
                                                  (char *)in_stack_fffffffffffffaa8);
                          if ((bVar1) ||
                             (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffab0,
                                                  (char *)in_stack_fffffffffffffaa8), bVar1)) {
                            local_1c = local_1c + 1;
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_fffffffffffffaf4,
                                                   in_stack_fffffffffffffaf0),
                                       (char *)in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
                            in_stack_fffffffffffffac4 =
                                 std::__cxx11::stoi((string *)in_stack_fffffffffffffab0,
                                                    (size_t *)in_stack_fffffffffffffaa8,0);
                            local_18[9] = in_stack_fffffffffffffac4;
                            std::__cxx11::string::~string
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_fffffffffffffab0);
                            std::allocator<char>::~allocator(local_419);
                          }
                          else {
                            in_stack_fffffffffffffac3 =
                                 std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffab0,
                                                 (char *)in_stack_fffffffffffffaa8);
                            if (((bool)in_stack_fffffffffffffac3) ||
                               (in_stack_fffffffffffffac2 =
                                     std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffab0,
                                                  (char *)in_stack_fffffffffffffaa8),
                               (bool)in_stack_fffffffffffffac2)) {
                              local_1c = local_1c + 1;
                              std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_fffffffffffffab0,
                                        (char *)in_stack_fffffffffffffaa8);
                            }
                            else {
                              in_stack_fffffffffffffac1 =
                                   std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffab0,
                                                  (char *)in_stack_fffffffffffffaa8);
                              if (((bool)in_stack_fffffffffffffac1) ||
                                 (in_stack_fffffffffffffac0 =
                                       std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffab0,
                                                  (char *)in_stack_fffffffffffffaa8),
                                 (bool)in_stack_fffffffffffffac0)) {
                                *(undefined1 *)((long)local_18 + 0x69) = 1;
                              }
                              else {
                                in_stack_fffffffffffffabf =
                                     std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffab0,
                                                  (char *)in_stack_fffffffffffffaa8);
                                if ((bool)in_stack_fffffffffffffabf) {
                                  *(undefined1 *)((long)local_18 + 0x69) = 1;
                                  *(undefined1 *)((long)local_18 + 0x6a) = 1;
                                }
                                else {
                                  in_stack_fffffffffffffabe =
                                       std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffab0,
                                                  (char *)in_stack_fffffffffffffaa8);
                                  if ((bool)in_stack_fffffffffffffabe) {
                                    *(undefined1 *)(local_18 + 0x1a) = 1;
                                  }
                                  else {
                                    in_stack_fffffffffffffabd =
                                         std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffab0,
                                                  (char *)in_stack_fffffffffffffaa8);
                                    if ((!(bool)in_stack_fffffffffffffabd) &&
                                       (in_stack_fffffffffffffabc =
                                             std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffab0,
                                                  (char *)in_stack_fffffffffffffaa8),
                                       !(bool)in_stack_fffffffffffffabc)) {
                                      uVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffab0,
                                                  (char *)in_stack_fffffffffffffaa8);
                                      if ((!(bool)uVar2) &&
                                         (in_stack_fffffffffffffaba =
                                               std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffab0,
                                                  (char *)in_stack_fffffffffffffaa8),
                                         !(bool)in_stack_fffffffffffffaba)) {
                                        __stream = _stderr;
                                        pcVar4 = std::__cxx11::
                                                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 ::c_str((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)_stderr);
                                        fprintf(__stream,"error: unknown argument: %s\n",pcVar4);
                                        gpt_print_usage(in_stack_fffffffffffffac4,
                                                        (char **)CONCAT17(in_stack_fffffffffffffabf,
                                                                          CONCAT16(
                                                  in_stack_fffffffffffffabe,
                                                  CONCAT15(in_stack_fffffffffffffabd,
                                                           CONCAT14(in_stack_fffffffffffffabc,
                                                                    CONCAT13(uVar2,CONCAT12(
                                                  in_stack_fffffffffffffaba,
                                                  in_stack_fffffffffffffab8)))))),
                                                  (gpt_params *)__stream);
                                        exit(0);
                                      }
                                      gpt_print_usage(in_stack_fffffffffffffac4,
                                                      (char **)CONCAT17(in_stack_fffffffffffffabf,
                                                                        CONCAT16(
                                                  in_stack_fffffffffffffabe,
                                                  CONCAT15(in_stack_fffffffffffffabd,
                                                           CONCAT14(in_stack_fffffffffffffabc,
                                                                    CONCAT13(uVar2,CONCAT12(
                                                  in_stack_fffffffffffffaba,
                                                  in_stack_fffffffffffffab8)))))),
                                                  in_stack_fffffffffffffab0);
                                      exit(0);
                                    }
                                    local_1c = local_1c + 1;
                                    std::__cxx11::
                                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    ::operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)in_stack_fffffffffffffab0,
                                                (char *)in_stack_fffffffffffffaa8);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffab0);
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

bool gpt_params_parse(int argc, char ** argv, gpt_params & params) {
    for (int i = 1; i < argc; i++) {
        std::string arg = argv[i];

        if (arg == "-s" || arg == "--seed") {
            params.seed = std::stoi(argv[++i]);
        } else if (arg == "-t" || arg == "--threads") {
            params.n_threads = std::stoi(argv[++i]);
        } else if (arg == "-p" || arg == "--prompt") {
            params.interactive = false;
            params.interactive_start = false;
            params.use_color = false;

            params.prompt = argv[++i];
        } else if (arg == "-f" || arg == "--file") {

            params.interactive = false;
            params.interactive_start = false;
            params.use_color = false;

            std::ifstream file(argv[++i]);

            std::copy(std::istreambuf_iterator<char>(file),
                    std::istreambuf_iterator<char>(),
                    back_inserter(params.prompt));
                
        } else if (arg == "-n" || arg == "--n_predict") {
            params.n_predict = std::stoi(argv[++i]);
        } else if (arg == "--top_k") {
            params.top_k = std::stoi(argv[++i]);
        } else if (arg == "-c" || arg == "--ctx_size") {
            params.n_ctx = std::stoi(argv[++i]);
        } else if (arg == "--top_p") {
            params.top_p = std::stof(argv[++i]);
        } else if (arg == "--temp") {
            params.temp = std::stof(argv[++i]);
        } else if (arg == "--repeat_last_n") {
            params.repeat_last_n = std::stoi(argv[++i]);
        } else if (arg == "--repeat_penalty") {
            params.repeat_penalty = std::stof(argv[++i]);
        } else if (arg == "-b" || arg == "--batch_size") {
            params.n_batch = std::stoi(argv[++i]);
        } else if (arg == "-m" || arg == "--model") {
            params.model = argv[++i];
        } else if (arg == "-i" || arg == "--interactive") {
            params.interactive = true;
        } else if (arg == "--interactive-start") {
            params.interactive = true;
            params.interactive_start = true;
        } else if (arg == "--color") {
            params.use_color = true;
        } else if (arg == "-r" || arg == "--reverse-prompt") {
            params.antiprompt = argv[++i];
        } else if (arg == "-h" || arg == "--help") {
            gpt_print_usage(argc, argv, params);
            exit(0);
        } else {
            fprintf(stderr, "error: unknown argument: %s\n", arg.c_str());
            gpt_print_usage(argc, argv, params);
            exit(0);
        }
    }

    return true;
}